

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

void __thiscall
jbcoin::STObject::setFieldUsingAssignment<jbcoin::STArray>
          (STObject *this,SField *field,STArray *value)

{
  int iVar1;
  STArray *this_00;
  
  this_00 = (STArray *)getPField(this,field,true);
  if (this_00 == (STArray *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*(this_00->super_STBase)._vptr_STBase[4])(this_00);
  if (iVar1 == 0) {
    this_00 = (STArray *)makeFieldPresent(this,field);
    if (this_00 == (STArray *)0x0) goto LAB_001fcfa3;
  }
  if ((this_00->super_STBase)._vptr_STBase == (_func_int **)&PTR__STArray_002f7fa8) {
    STArray::operator=(this_00,value);
    return;
  }
LAB_001fcfa3:
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
}

Assistant:

void setFieldUsingAssignment (SField const& field, T const& value)
    {
        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        (*cf) = value;
    }